

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableUpdateBorders(ImGuiTable *table)

{
  short sVar1;
  ImGuiTableColumn *pIVar2;
  bool bVar3;
  int iVar4;
  ImGuiTableInstanceData *pIVar5;
  ImGuiID id;
  ulong uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  bool held;
  bool hovered;
  ImRect hit_rect;
  bool local_82;
  bool local_81;
  float local_80;
  float local_7c;
  ImRect local_78;
  ImGuiContext *local_68;
  ImGuiTableInstanceData *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if ((long)table->InstanceCurrent == 0) {
    pIVar5 = &table->InstanceDataFirst;
  }
  else {
    pIVar5 = (table->InstanceDataExtra).Data + (long)table->InstanceCurrent + -1;
  }
  iVar4 = table->ColumnsCount;
  if (0 < iVar4) {
    local_68 = GImGui;
    local_58 = ZEXT416((uint)(float)(int)(GImGui->CurrentDpiScale * 4.0));
    local_7c = (float)table->RowBgColor[(ulong)(table->FreezeRowsCount < 1) * 8 + 0x16] +
               table->AngledHeadersHeight;
    fVar8 = (table->OuterRect).Max.y;
    fVar9 = (pIVar5->LastOuterHeight + local_7c) - table->AngledHeadersHeight;
    uVar7 = -(uint)(fVar9 <= fVar8);
    local_48 = ZEXT416(uVar7 & (uint)fVar8 | ~uVar7 & (uint)fVar9);
    local_80 = pIVar5->LastTopHeadersRowHeight + local_7c;
    local_60 = &table->InstanceDataFirst;
    uVar6 = 0;
    do {
      if ((table->EnabledMaskByDisplayOrder[uVar6 >> 5 & 0x7ffffff] >> ((uint)uVar6 & 0x1f) & 1) !=
          0) {
        pIVar2 = (table->Columns).Data;
        sVar1 = (table->DisplayOrderToIndex).Data[uVar6];
        if ((pIVar2[sVar1].Flags & 0x40000020U) == 0) {
          local_78.Max.y = (float)local_48._0_4_;
          if ((((table->Flags & 0x800) == 0) ||
              (local_78.Max.y = local_80, table->IsUsingHeaders != false)) &&
             ((pIVar2[sVar1].IsVisibleX != false || (table->LastResizedColumn == sVar1)))) {
            pIVar5 = local_60;
            if ((long)table->InstanceCurrent != 0) {
              pIVar5 = (table->InstanceDataExtra).Data + (long)table->InstanceCurrent + -1;
            }
            id = (int)sVar1 + pIVar5->TableInstanceID + 1;
            local_78.Min.x = pIVar2[sVar1].MaxX - (float)local_58._0_4_;
            local_78.Max.x = pIVar2[sVar1].MaxX + (float)local_58._0_4_;
            local_78.Min.y = local_7c;
            ItemAdd(&local_78,id,(ImRect *)0x0,2);
            local_81 = false;
            local_82 = false;
            bVar3 = ButtonBehavior(&local_78,id,&local_81,&local_82,0x40910);
            if ((bVar3) && (bVar3 = IsMouseDoubleClicked(0), bVar3)) {
              pIVar2 = (table->Columns).Data;
              if (pIVar2[sVar1].IsEnabled == true) {
                pIVar2[sVar1].CannotSkipItemsQueue = '\x01';
                table->AutoFitSingleColumn = sVar1;
              }
              ClearActiveID();
              local_82 = false;
            }
            if (local_82 == true) {
              if (table->LastResizedColumn == -1) {
                fVar8 = -3.4028235e+38;
                if ((long)table->RightMostEnabledColumn != -1) {
                  fVar8 = (table->Columns).Data[table->RightMostEnabledColumn].MaxX;
                }
                table->ResizeLockMinContentsX2 = fVar8;
              }
              table->ResizedColumn = sVar1;
              table->InstanceInteracted = table->InstanceCurrent;
              if (local_81 != false) {
LAB_001af693:
                if (local_68->HoveredIdTimer <= 0.06 && local_82 == false) goto LAB_001af6c0;
              }
              table->HoveredColumnBorder = sVar1;
              SetMouseCursor(4);
            }
            else if (local_81 == true) goto LAB_001af693;
LAB_001af6c0:
            iVar4 = table->ColumnsCount;
          }
        }
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)iVar4);
  }
  return;
}

Assistant:

void ImGui::TableUpdateBorders(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->Flags & ImGuiTableFlags_Resizable);

    // At this point OuterRect height may be zero or under actual final height, so we rely on temporal coherency and
    // use the final height from last frame. Because this is only affecting _interaction_ with columns, it is not
    // really problematic (whereas the actual visual will be displayed in EndTable() and using the current frame height).
    // Actual columns highlight/render will be performed in EndTable() and not be affected.
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    const float hit_half_width = ImTrunc(TABLE_RESIZE_SEPARATOR_HALF_THICKNESS * g.CurrentDpiScale);
    const float hit_y1 = (table->FreezeRowsCount >= 1 ? table->OuterRect.Min.y : table->WorkRect.Min.y) + table->AngledHeadersHeight;
    const float hit_y2_body = ImMax(table->OuterRect.Max.y, hit_y1 + table_instance->LastOuterHeight - table->AngledHeadersHeight);
    const float hit_y2_head = hit_y1 + table_instance->LastTopHeadersRowHeight;

    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!IM_BITARRAY_TESTBIT(table->EnabledMaskByDisplayOrder, order_n))
            continue;

        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_))
            continue;

        // ImGuiTableFlags_NoBordersInBodyUntilResize will be honored in TableDrawBorders()
        const float border_y2_hit = (table->Flags & ImGuiTableFlags_NoBordersInBody) ? hit_y2_head : hit_y2_body;
        if ((table->Flags & ImGuiTableFlags_NoBordersInBody) && table->IsUsingHeaders == false)
            continue;

        if (!column->IsVisibleX && table->LastResizedColumn != column_n)
            continue;

        ImGuiID column_id = TableGetColumnResizeID(table, column_n, table->InstanceCurrent);
        ImRect hit_rect(column->MaxX - hit_half_width, hit_y1, column->MaxX + hit_half_width, border_y2_hit);
        ItemAdd(hit_rect, column_id, NULL, ImGuiItemFlags_NoNav);
        //GetForegroundDrawList()->AddRect(hit_rect.Min, hit_rect.Max, IM_COL32(255, 0, 0, 100));

        bool hovered = false, held = false;
        bool pressed = ButtonBehavior(hit_rect, column_id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnDoubleClick | ImGuiButtonFlags_NoNavFocus);
        if (pressed && IsMouseDoubleClicked(0))
        {
            TableSetColumnWidthAutoSingle(table, column_n);
            ClearActiveID();
            held = false;
        }
        if (held)
        {
            if (table->LastResizedColumn == -1)
                table->ResizeLockMinContentsX2 = table->RightMostEnabledColumn != -1 ? table->Columns[table->RightMostEnabledColumn].MaxX : -FLT_MAX;
            table->ResizedColumn = (ImGuiTableColumnIdx)column_n;
            table->InstanceInteracted = table->InstanceCurrent;
        }
        if ((hovered && g.HoveredIdTimer > TABLE_RESIZE_SEPARATOR_FEEDBACK_TIMER) || held)
        {
            table->HoveredColumnBorder = (ImGuiTableColumnIdx)column_n;
            SetMouseCursor(ImGuiMouseCursor_ResizeEW);
        }
    }
}